

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O2

bool __thiscall Commodore::Vic20::ConcreteMachine::insert_media(ConcreteMachine *this,Media *media)

{
  __shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *this_00;
  __shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Machine *this_01;
  pointer psVar3;
  bool bVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rom_image;
  __shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  __shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2> local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  p_Var1 = &((media->tapes).
             super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>;
  if (p_Var1 != &((media->tapes).
                  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>) {
    this_00 = (this->tape_).
              super___shared_ptr<Storage::Tape::BinaryTapePlayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,p_Var1);
    Storage::Tape::TapePlayer::set_tape
              (&this_00->super_TapePlayer,(shared_ptr<Storage::Tape::Tape> *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  p_Var2 = &((media->disks).
             super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>;
  if ((p_Var2 != &((media->disks).
                   super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>) &&
     (this_01 = (this->c1540_).
                super___shared_ptr<Commodore::C1540::Machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     this_01 != (Machine *)0x0)) {
    std::__shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_58,p_Var2);
    C1540::Machine::set_disk(this_01,(shared_ptr<Storage::Disk::Disk> *)&_Stack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  }
  psVar3 = (media->cartridges).
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar3 != (media->cartridges).
                super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    this->rom_address_ = 0xa000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
               &((((psVar3->
                   super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->segments_).
                 super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->data);
    this->rom_length_ =
         (short)local_38._M_impl.super__Vector_impl_data._M_finish -
         (short)local_38._M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->rom_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->rom_,0x2000);
    write_to_map(this,this->processor_read_memory_map_,
                 (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,this->rom_address_,this->rom_length_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  }
  set_use_fast_tape(this);
  bVar4 = true;
  if (((media->tapes).
       super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (media->tapes).
       super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((media->disks).
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (media->disks).
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ||
      ((this->c1540_).super___shared_ptr<Commodore::C1540::Machine,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr == (element_type *)0x0)))) {
    bVar4 = (media->cartridges).
            super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (media->cartridges).
            super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  return bVar4;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.tapes.empty()) {
				tape_->set_tape(media.tapes.front());
			}

			if(!media.disks.empty() && c1540_) {
				c1540_->set_disk(media.disks.front());
			}

			if(!media.cartridges.empty()) {
				rom_address_ = 0xa000;
				std::vector<uint8_t> rom_image = media.cartridges.front()->get_segments().front().data;
				rom_length_ = uint16_t(rom_image.size());

				rom_ = rom_image;
				rom_.resize(0x2000);
				write_to_map(processor_read_memory_map_, rom_.data(), rom_address_, rom_length_);
			}

			set_use_fast_tape();

			return !media.tapes.empty() || (!media.disks.empty() && c1540_ != nullptr) || !media.cartridges.empty();
		}